

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

string * __thiscall
banksia::ChessBoard::toString_abi_cxx11_(string *__return_storage_ptr__,ChessBoard *this)

{
  int iVar1;
  ostream *poVar2;
  Piece PVar3;
  undefined8 uVar4;
  int i;
  uint pos;
  string local_1c8;
  ostringstream stringStream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stringStream);
  uVar4 = 1;
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0xb])(&local_1c8,this,0);
  poVar2 = std::operator<<((ostream *)&stringStream,(string *)&local_1c8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_1c8);
  for (pos = 0; pos != 0x40; pos = pos + 1) {
    PVar3 = BoardCore::getPiece(&this->super_BoardCore,pos);
    Piece::toString_abi_cxx11_
              (&local_1c8,(Piece *)((ulong)PVar3 & 0xffffffff),PVar3.side,(Side)uVar4);
    poVar2 = std::operator<<((ostream *)&stringStream,(string *)&local_1c8);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string((string *)&local_1c8);
    if (pos != 0) {
      iVar1 = (*(this->super_BoardCore).super_Obj._vptr_Obj[8])(this,(ulong)pos);
      if (iVar1 == 7) {
        iVar1 = (*(this->super_BoardCore).super_Obj._vptr_Obj[9])(this,(ulong)pos);
        poVar2 = std::operator<<((ostream *)&stringStream," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,8 - iVar1);
        std::operator<<(poVar2,"\n");
      }
    }
  }
  std::operator<<((ostream *)&stringStream,"a b c d e f g h \n");
  poVar2 = std::operator<<((ostream *)&stringStream,"key: ");
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0xc])(this);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stringStream);
  return __return_storage_ptr__;
}

Assistant:

std::string ChessBoard::toString() const {
    
    std::ostringstream stringStream;
    
    stringStream << getFen() << std::endl;
    
    for (int i = 0; i<64; i++) {
        auto piece = getPiece(i);
        
        stringStream << Piece::toString(piece.type, piece.side) << " ";
        
        if (i > 0 && getColumn(i) == 7) {
            int row = 8 - getRow(i);
            stringStream << " " << row << "\n";
        }
    }
    
    stringStream << "a b c d e f g h \n";
    stringStream << "key: " << key() << std::endl;
    
    return stringStream.str();
}